

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O1

bool ZXing::IsInside<ZXing::PointT<int>>(PointT<int> *p,Quadrilateral<ZXing::PointT<int>_> *q)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  
  iVar2 = 0;
  lVar6 = 1;
  iVar5 = 0;
  do {
    iVar3 = (q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[lVar6 + -1].x;
    iVar4 = (q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[lVar6 + -1].y;
    uVar7 = (uint)lVar6 & 3;
    iVar8 = ((q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[uVar7].x - iVar3) * (iVar4 - p->y);
    iVar4 = ((q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[uVar7].y - iVar4) * (p->x - iVar3);
    iVar3 = iVar2;
    if (iVar4 + iVar8 < 0) {
      iVar3 = iVar5;
    }
    iVar1 = iVar3 + 1;
    if (iVar4 + iVar8 < 0) {
      iVar1 = iVar2;
      iVar5 = iVar3 + 1;
    }
    iVar2 = iVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return iVar5 == 0 || iVar2 == 0;
}

Assistant:

bool IsInside(const PointT& p, const Quadrilateral<PointT>& q)
{
	// Test if p is on the same side (right or left) of all polygon segments
	int pos = 0, neg = 0;
	for (int i = 0; i < Size(q); ++i)
		(cross(p - q[i], q[(i + 1) % Size(q)] - q[i]) < 0 ? neg : pos)++;
	return pos == 0 || neg == 0;
}